

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O1

void __thiscall amrex::TagBoxArray::coarsen(TagBoxArray *this,IntVect *ratio)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int dir;
  Box result_1;
  Box result;
  IntVect new_n_grow;
  MFIter mfi;
  undefined8 local_128;
  uint local_120;
  uint local_11c [3];
  IndexType IStack_110;
  Box local_108;
  int local_e4 [4];
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Box local_ac;
  MFIter local_90;
  
  local_e4[0] = 0;
  local_e4[1] = 0;
  local_e4[2] = 0;
  lVar10 = 0;
  do {
    local_e4[lVar10] =
         ((this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect[lVar10] +
          ratio->vect[lVar10] + -1) / ratio->vect[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  MFIter::MFIter(&local_90,(FabArrayBase *)this,(ParallelDescriptor::m_Team._4_4_ != 1) * '\x02');
  if (local_90.currentIndex < local_90.endIndex) {
    local_c8 = CONCAT44(local_e4[2],local_e4[1]);
    uStack_c0 = 0;
    local_e4[3] = local_e4[0];
    iStack_d4 = local_e4[1];
    iStack_d0 = local_e4[2];
    iStack_cc = local_e4[0];
    do {
      BATransformer::operator()
                (&local_ac,&((local_90.fabArray)->boxarray).m_bat,
                 (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                        *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      local_11c[1] = local_ac.bigend.vect[1];
      local_11c[2] = local_ac.bigend.vect[2];
      IStack_110.itype = local_ac.btype.itype;
      local_128._0_4_ = local_ac.smallend.vect[0];
      local_128._4_4_ = local_ac.smallend.vect[1];
      local_120 = local_ac.smallend.vect[2];
      local_11c[0] = local_ac.bigend.vect[0];
      iVar2 = ratio->vect[0];
      iVar3 = ratio->vect[1];
      if (((iVar2 != 1) || (iVar3 != 1)) || (ratio->vect[2] != 1)) {
        local_128._0_4_ = local_ac.smallend.vect[0];
        if (iVar2 != 1) {
          if (iVar2 == 4) {
            if ((int)(uint)local_128 < 0) {
              local_128._0_4_ = (uint)local_128 + 1;
              uVar5 = -(uint)local_128;
              if (0 < (int)(uint)local_128) {
                uVar5 = (uint)local_128;
              }
              uVar5 = uVar5 >> 2;
LAB_005bebef:
              local_128._0_4_ = ~uVar5;
            }
            else {
              local_128._0_4_ = (uint)local_128 >> 2;
            }
          }
          else if (iVar2 == 2) {
            if ((int)(uint)local_128 < 0) {
              local_128._0_4_ = (uint)local_128 + 1;
              uVar5 = -(uint)local_128;
              if (0 < (int)(uint)local_128) {
                uVar5 = (uint)local_128;
              }
              uVar5 = uVar5 >> 1;
              goto LAB_005bebef;
            }
            local_128._0_4_ = (uint)local_128 >> 1;
          }
          else if ((int)(uint)local_128 < 0) {
            iVar9 = (uint)local_128 + 1;
            iVar1 = -iVar9;
            if (0 < iVar9) {
              iVar1 = iVar9;
            }
            local_128._0_4_ = ~(iVar1 / iVar2);
          }
          else {
            local_128._0_4_ = (int)(uint)local_128 / iVar2;
          }
        }
        local_128._4_4_ = local_ac.smallend.vect[1];
        if (iVar3 != 1) {
          if (iVar3 == 4) {
            if ((long)local_ac.smallend.vect._0_8_ < 0) {
              local_128._4_4_ = local_128._4_4_ + 1;
              uVar5 = -local_128._4_4_;
              if (0 < (int)local_128._4_4_) {
                uVar5 = local_128._4_4_;
              }
              uVar5 = uVar5 >> 2;
LAB_005bec4e:
              local_128._4_4_ = ~uVar5;
            }
            else {
              local_128._4_4_ = local_128._4_4_ >> 2;
            }
          }
          else if (iVar3 == 2) {
            if ((long)local_ac.smallend.vect._0_8_ < 0) {
              local_128._4_4_ = local_128._4_4_ + 1;
              uVar5 = -local_128._4_4_;
              if (0 < (int)local_128._4_4_) {
                uVar5 = local_128._4_4_;
              }
              uVar5 = uVar5 >> 1;
              goto LAB_005bec4e;
            }
            local_128._4_4_ = local_128._4_4_ >> 1;
          }
          else if ((long)local_ac.smallend.vect._0_8_ < 0) {
            iVar9 = local_128._4_4_ + 1;
            iVar1 = -iVar9;
            if (0 < iVar9) {
              iVar1 = iVar9;
            }
            local_128._4_4_ = ~(iVar1 / iVar3);
          }
          else {
            local_128._4_4_ = (int)local_128._4_4_ / iVar3;
          }
        }
        iVar1 = ratio->vect[2];
        if (iVar1 != 1) {
          if (iVar1 == 4) {
            if (local_ac.smallend.vect[2] < 0) {
              uVar5 = local_ac.smallend.vect[2] + 1;
              local_120 = -uVar5;
              if (0 < (int)uVar5) {
                local_120 = uVar5;
              }
              local_120 = local_120 >> 2;
LAB_005becb6:
              local_120 = ~local_120;
            }
            else {
              local_120 = (uint)local_ac.smallend.vect[2] >> 2;
            }
          }
          else if (iVar1 == 2) {
            if (local_ac.smallend.vect[2] < 0) {
              uVar5 = local_ac.smallend.vect[2] + 1;
              local_120 = -uVar5;
              if (0 < (int)uVar5) {
                local_120 = uVar5;
              }
              local_120 = local_120 >> 1;
              goto LAB_005becb6;
            }
            local_120 = (uint)local_ac.smallend.vect[2] >> 1;
          }
          else if (local_ac.smallend.vect[2] < 0) {
            iVar6 = local_ac.smallend.vect[2] + 1;
            iVar9 = -iVar6;
            if (0 < iVar6) {
              iVar9 = iVar6;
            }
            local_120 = ~(iVar9 / iVar1);
          }
          else {
            local_120 = local_ac.smallend.vect[2] / iVar1;
          }
        }
        IStack_110.itype = local_ac.btype.itype;
        local_11c[2] = local_ac.bigend.vect[2];
        if (IStack_110.itype == 0) {
          if (iVar2 != 1) {
            if (iVar2 == 4) {
              if (local_ac.bigend.vect[0] < 0) {
                uVar5 = local_ac.bigend.vect[0] + 1;
                local_11c[0] = -uVar5;
                if (0 < (int)uVar5) {
                  local_11c[0] = uVar5;
                }
                local_11c[0] = local_11c[0] >> 2;
LAB_005bef7f:
                local_11c[0] = ~local_11c[0];
              }
              else {
                local_11c[0] = (uint)local_ac.bigend.vect[0] >> 2;
              }
            }
            else if (iVar2 == 2) {
              if (local_ac.bigend.vect[0] < 0) {
                uVar5 = local_ac.bigend.vect[0] + 1;
                local_11c[0] = -uVar5;
                if (0 < (int)uVar5) {
                  local_11c[0] = uVar5;
                }
                local_11c[0] = local_11c[0] >> 1;
                goto LAB_005bef7f;
              }
              local_11c[0] = (uint)local_ac.bigend.vect[0] >> 1;
            }
            else if (local_ac.bigend.vect[0] < 0) {
              iVar6 = local_ac.bigend.vect[0] + 1;
              iVar9 = -iVar6;
              if (0 < iVar6) {
                iVar9 = iVar6;
              }
              local_11c[0] = ~(iVar9 / iVar2);
            }
            else {
              local_11c[0] = local_ac.bigend.vect[0] / iVar2;
            }
          }
          if (iVar3 != 1) {
            if (iVar3 == 4) {
              if (local_ac.bigend.vect[1] < 0) {
                uVar5 = local_ac.bigend.vect[1] + 1;
                local_11c[1] = -uVar5;
                if (0 < (int)uVar5) {
                  local_11c[1] = uVar5;
                }
                local_11c[1] = local_11c[1] >> 2;
LAB_005befdf:
                local_11c[1] = ~local_11c[1];
              }
              else {
                local_11c[1] = (uint)local_ac.bigend.vect[1] >> 2;
              }
            }
            else if (iVar3 == 2) {
              if (local_ac.bigend.vect[1] < 0) {
                uVar5 = local_ac.bigend.vect[1] + 1;
                local_11c[1] = -uVar5;
                if (0 < (int)uVar5) {
                  local_11c[1] = uVar5;
                }
                local_11c[1] = local_11c[1] >> 1;
                goto LAB_005befdf;
              }
              local_11c[1] = (uint)local_ac.bigend.vect[1] >> 1;
            }
            else if (local_ac.bigend.vect[1] < 0) {
              iVar9 = local_ac.bigend.vect[1] + 1;
              iVar2 = -iVar9;
              if (0 < iVar9) {
                iVar2 = iVar9;
              }
              local_11c[1] = ~(iVar2 / iVar3);
            }
            else {
              local_11c[1] = local_ac.bigend.vect[1] / iVar3;
            }
          }
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)local_11c[2] < 0) {
                local_11c[2] = local_11c[2] + 1;
                uVar5 = -local_11c[2];
                if (0 < (int)local_11c[2]) {
                  uVar5 = local_11c[2];
                }
                uVar5 = uVar5 >> 2;
LAB_005bf050:
                local_11c[2] = ~uVar5;
              }
              else {
                local_11c[2] = local_11c[2] >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)local_11c[2] < 0) {
                local_11c[2] = local_11c[2] + 1;
                uVar5 = -local_11c[2];
                if (0 < (int)local_11c[2]) {
                  uVar5 = local_11c[2];
                }
                uVar5 = uVar5 >> 1;
                goto LAB_005bf050;
              }
              local_11c[2] = local_11c[2] >> 1;
            }
            else if ((int)local_11c[2] < 0) {
              iVar3 = local_11c[2] + 1;
              iVar2 = -iVar3;
              if (0 < iVar3) {
                iVar2 = iVar3;
              }
              local_11c[2] = ~(iVar2 / iVar1);
            }
            else {
              local_11c[2] = (int)local_11c[2] / iVar1;
            }
          }
        }
        else {
          local_108.smallend.vect[0] = 0;
          local_108.smallend.vect[1] = 0;
          local_108.smallend.vect[2] = 0;
          lVar10 = 0;
          do {
            if (((IStack_110.itype >> ((uint)lVar10 & 0x1f) & 1) != 0) &&
               ((int)local_11c[lVar10] % ratio->vect[lVar10] != 0)) {
              local_108.smallend.vect[lVar10] = 1;
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          uVar5 = local_ac.bigend.vect[0];
          if (iVar2 != 1) {
            if (iVar2 == 4) {
              if (local_ac.bigend.vect[0] < 0) {
                uVar8 = local_ac.bigend.vect[0] + 1;
                uVar5 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar5 = uVar8;
                }
                uVar5 = uVar5 >> 2;
LAB_005beda8:
                uVar5 = ~uVar5;
              }
              else {
                uVar5 = (uint)local_ac.bigend.vect[0] >> 2;
              }
            }
            else if (iVar2 == 2) {
              if (local_ac.bigend.vect[0] < 0) {
                uVar8 = local_ac.bigend.vect[0] + 1;
                uVar5 = -uVar8;
                if (0 < (int)uVar8) {
                  uVar5 = uVar8;
                }
                uVar5 = uVar5 >> 1;
                goto LAB_005beda8;
              }
              uVar5 = (uint)local_ac.bigend.vect[0] >> 1;
            }
            else if (local_ac.bigend.vect[0] < 0) {
              iVar6 = local_ac.bigend.vect[0] + 1;
              iVar9 = -iVar6;
              if (0 < iVar6) {
                iVar9 = iVar6;
              }
              uVar5 = ~(iVar9 / iVar2);
            }
            else {
              uVar5 = local_ac.bigend.vect[0] / iVar2;
            }
          }
          uVar8 = local_ac.bigend.vect[1];
          if (iVar3 != 1) {
            if (iVar3 == 4) {
              if (local_ac.bigend.vect[1] < 0) {
                uVar7 = local_ac.bigend.vect[1] + 1;
                uVar8 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar8 = uVar7;
                }
                uVar8 = uVar8 >> 2;
LAB_005bee0a:
                uVar8 = ~uVar8;
              }
              else {
                uVar8 = (uint)local_ac.bigend.vect[1] >> 2;
              }
            }
            else if (iVar3 == 2) {
              if (local_ac.bigend.vect[1] < 0) {
                uVar7 = local_ac.bigend.vect[1] + 1;
                uVar8 = -uVar7;
                if (0 < (int)uVar7) {
                  uVar8 = uVar7;
                }
                uVar8 = uVar8 >> 1;
                goto LAB_005bee0a;
              }
              uVar8 = (uint)local_ac.bigend.vect[1] >> 1;
            }
            else if (local_ac.bigend.vect[1] < 0) {
              iVar9 = local_ac.bigend.vect[1] + 1;
              iVar2 = -iVar9;
              if (0 < iVar9) {
                iVar2 = iVar9;
              }
              uVar8 = ~(iVar2 / iVar3);
            }
            else {
              uVar8 = local_ac.bigend.vect[1] / iVar3;
            }
          }
          if (iVar1 != 1) {
            if (iVar1 == 4) {
              if ((int)local_11c[2] < 0) {
                local_11c[2] = local_11c[2] + 1;
                uVar7 = -local_11c[2];
                if (0 < (int)local_11c[2]) {
                  uVar7 = local_11c[2];
                }
                uVar7 = uVar7 >> 2;
LAB_005bee6e:
                local_11c[2] = ~uVar7;
              }
              else {
                local_11c[2] = local_11c[2] >> 2;
              }
            }
            else if (iVar1 == 2) {
              if ((int)local_11c[2] < 0) {
                local_11c[2] = local_11c[2] + 1;
                uVar7 = -local_11c[2];
                if (0 < (int)local_11c[2]) {
                  uVar7 = local_11c[2];
                }
                uVar7 = uVar7 >> 1;
                goto LAB_005bee6e;
              }
              local_11c[2] = local_11c[2] >> 1;
            }
            else if ((int)local_11c[2] < 0) {
              iVar3 = local_11c[2] + 1;
              iVar2 = -iVar3;
              if (0 < iVar3) {
                iVar2 = iVar3;
              }
              local_11c[2] = ~(iVar2 / iVar1);
            }
            else {
              local_11c[2] = (int)local_11c[2] / iVar1;
            }
          }
          local_11c[0] = uVar5 + local_108.smallend.vect[0];
          local_11c[1] = uVar8 + local_108.smallend.vect[1];
          local_11c[2] = local_11c[2] + local_108.smallend.vect[2];
        }
      }
      local_108.btype.itype = IStack_110.itype;
      local_108.smallend.vect[0] = (int)local_128;
      local_108.smallend.vect[1] = (int)((ulong)local_128 >> 0x20);
      local_108.smallend.vect[2] = local_120 - iStack_d0;
      local_108.bigend.vect[0] = local_11c[0] + iStack_cc;
      local_108.smallend.vect[1] = local_108.smallend.vect[1] - iStack_d4;
      local_108.smallend.vect[0] = local_108.smallend.vect[0] - local_e4[3];
      local_108.bigend.vect[1] = local_11c[1] + (int)local_c8;
      local_108.bigend.vect[2] = local_11c[2] + local_c8._4_4_;
      piVar4 = &local_90.currentIndex;
      if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar4 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_90.currentIndex;
      }
      TagBox::coarsen((this->super_FabArray<amrex::TagBox>).m_fabs_v.
                      super__Vector_base<amrex::TagBox_*,_std::allocator<amrex::TagBox_*>_>._M_impl.
                      super__Vector_impl_data._M_start[*piVar4],ratio,&local_108);
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  BoxArray::coarsen(&(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.boxarray,ratio);
  *(ulong *)(this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect =
       CONCAT44(local_e4[1],local_e4[0]);
  (this->super_FabArray<amrex::TagBox>).super_FabArrayBase.n_grow.vect[2] = local_e4[2];
  return;
}

Assistant:

void
TagBoxArray::coarsen (const IntVect & ratio)
{
    // If team is used, all team workers need to go through all the fabs,
    // including ones they don't own.
    int teamsize = ParallelDescriptor::TeamSize();
    unsigned char flags = (teamsize == 1) ? 0 : MFIter::AllBoxes;

    IntVect new_n_grow;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        new_n_grow[idim] = (n_grow[idim]+ratio[idim]-1)/ratio[idim];
    }

#if defined(AMREX_USE_OMP)
#pragma omp parallel if (teamsize == 1 && Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*this,flags); mfi.isValid(); ++mfi)
    {
        Box const& cbox = amrex::grow(amrex::coarsen(mfi.validbox(),ratio),new_n_grow);
        this->fabPtr(mfi)->coarsen(ratio,cbox);
    }

    boxarray.coarsen(ratio);
    n_grow = new_n_grow;
}